

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cc
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  pointer pfVar2;
  float fVar3;
  int iVar4;
  undefined8 in_RAX;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  ostream *poVar8;
  pointer pvVar9;
  size_t sVar10;
  undefined8 extraout_RAX;
  anon_class_1_0_00000001 *paVar11;
  anon_class_1_0_00000001 *paVar12;
  istream *piVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  anon_class_1_0_00000001 *paVar17;
  anon_class_1_0_00000001 *paVar18;
  vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  *this;
  anon_class_1_0_00000001 *in_R8;
  anon_class_4_1_a88e3f2b *in_R9;
  file_format format;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  string parameter;
  anon_class_4_1_a88e3f2b output_pair;
  ifstream file_stream;
  float local_35c;
  Compressed_lower_distance_matrix local_358;
  float local_31c;
  undefined8 local_318;
  char **local_310;
  float local_304;
  ulong local_300;
  long local_2f8;
  double local_2f0;
  Euclidean_distance_matrix local_2e8;
  int *local_2d0;
  Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> local_2c8;
  Sparse_distance_matrix<Params> local_298;
  vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  local_278;
  pointer ppfStack_260;
  vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  local_258;
  pointer ppfStack_240;
  long *local_238 [2];
  long local_228 [2];
  byte abStack_218 [488];
  
  local_2f0 = (double)CONCAT44(local_2f0._4_4_,argc);
  if (argc < 2) {
    local_304 = 1.0;
    local_35c = 3.4028235e+38;
    uVar15 = 1;
    format = DISTANCE_MATRIX;
    piVar6 = (int *)0x0;
    local_300 = 2;
  }
  else {
    local_2f8 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
    local_35c = 3.4028235e+38;
    local_304 = 1.0;
    local_300 = 2;
    iVar14 = 1;
    local_2d0 = (int *)0x0;
    local_318 = 2;
    local_310 = argv;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_238,argv[iVar14],(allocator<char> *)&local_358);
      iVar4 = std::__cxx11::string::compare((char *)local_238);
      if (iVar4 == 0) {
        iVar14 = 0;
        goto LAB_001042db;
      }
      iVar4 = std::__cxx11::string::compare((char *)local_238);
      if (iVar4 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_358,argv[(long)iVar14 + 1],(allocator<char> *)&local_2e8);
        pfVar2 = local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = __errno_location();
        iVar4 = *piVar6;
        *piVar6 = 0;
        lVar5 = strtol((char *)pfVar2,(char **)&local_2e8,10);
        if (local_2e8.points.
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == (pointer)pfVar2) goto LAB_001042ea;
        if (*piVar6 == 0x22) goto LAB_001042f6;
        if (*piVar6 == 0) {
          *piVar6 = iVar4;
        }
        local_2f8 = lVar5;
        if ((pointer)((long)local_2e8.points.
                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - (long)pfVar2) !=
            (pointer)local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish) goto LAB_001042e0;
LAB_00103941:
        argv = local_310;
        if ((pointer *)
            local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
LAB_00103955:
          operator_delete(local_358.distances.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&(((_Vector_base<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>
                                            *)local_358.distances.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_impl).super__Vector_impl_data._M_start + 1));
        }
LAB_00103962:
        iVar14 = iVar14 + 1;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)local_238);
        if (iVar4 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_358,argv[(long)iVar14 + 1],(allocator<char> *)&local_2e8);
          pfVar2 = local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar6 = __errno_location();
          iVar4 = *piVar6;
          *piVar6 = 0;
          local_35c = strtof((char *)pfVar2,(char **)&local_2e8);
          if (local_2e8.points.
              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == (pointer)pfVar2) goto LAB_00104318;
          if (*piVar6 == 0x22) goto LAB_0010430c;
          if (*piVar6 == 0) {
            *piVar6 = iVar4;
          }
          if ((pointer)((long)local_2e8.points.
                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)pfVar2) !=
              (pointer)local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl
                       .super__Vector_impl_data._M_finish) goto LAB_00104302;
          goto LAB_00103941;
        }
        iVar4 = std::__cxx11::string::compare((char *)local_238);
        if (iVar4 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_358,argv[(long)iVar14 + 1],(allocator<char> *)&local_2e8);
          pfVar2 = local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar6 = __errno_location();
          iVar4 = *piVar6;
          *piVar6 = 0;
          fVar21 = strtof((char *)pfVar2,(char **)&local_2e8);
          if (local_2e8.points.
              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == (pointer)pfVar2) goto LAB_0010433a;
          if (*piVar6 == 0x22) goto LAB_0010432e;
          if (*piVar6 == 0) {
            *piVar6 = iVar4;
          }
          local_304 = fVar21;
          if ((pointer)((long)local_2e8.points.
                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)pfVar2) !=
              (pointer)local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl
                       .super__Vector_impl_data._M_finish) goto LAB_00104324;
          goto LAB_00103941;
        }
        iVar4 = std::__cxx11::string::compare((char *)local_238);
        if (iVar4 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_358,argv[(long)iVar14 + 1],(allocator<char> *)&local_2e8);
          local_318 = 0;
          lVar5 = std::__cxx11::string::rfind((char *)&local_358,0x13d5f7,0);
          uVar7 = local_300;
          if (lVar5 != 0) {
            lVar5 = std::__cxx11::string::rfind((char *)&local_358,0x13d5fd,0);
            if (lVar5 == 0) {
              local_318 = 1;
              uVar7 = local_300;
            }
            else {
              lVar5 = std::__cxx11::string::rfind((char *)&local_358,0x13d603,0);
              if (lVar5 == 0) {
                local_318 = 2;
                uVar7 = local_300;
              }
              else {
                lVar5 = std::__cxx11::string::rfind((char *)&local_358,0x13d608,0);
                if (lVar5 == 0) {
                  local_318 = 3;
                  uVar7 = local_300;
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)&local_358);
                  if (iVar4 == 0) {
                    local_318 = 4;
                    uVar7 = local_300;
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)&local_358);
                    if (iVar4 == 0) {
                      local_318 = 5;
                      uVar7 = local_300;
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)&local_358);
                      local_318 = 6;
                      uVar7 = local_300;
                      if (iVar4 != 0) {
                        print_usage_and_exit(-1);
                        if ((pointer *)
                            local_358.distances.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start !=
                            &local_358.distances.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          operator_delete(local_358.distances.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start,
                                          (ulong)((long)&(((
                                                  _Vector_base<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>
                                                  *)local_358.distances.
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  ->_M_impl).super__Vector_impl_data._M_start + 1));
                        }
                        if (local_238[0] != local_228) {
                          operator_delete(local_238[0],local_228[0] + 1);
                        }
                        _Unwind_Resume(extraout_RAX);
                      }
                    }
                  }
                }
              }
            }
          }
LAB_00103b88:
          local_300 = uVar7;
          if ((pointer *)
              local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) goto LAB_00103955;
          goto LAB_00103962;
        }
        iVar4 = std::__cxx11::string::compare((char *)local_238);
        if (iVar4 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_358,argv[(long)iVar14 + 1],(allocator<char> *)&local_2e8);
          pfVar2 = local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar6 = __errno_location();
          iVar4 = *piVar6;
          *piVar6 = 0;
          uVar7 = strtol((char *)pfVar2,(char **)&local_2e8,10);
          if (local_2e8.points.
              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)pfVar2) {
            if (*piVar6 != 0x22) {
              if (*piVar6 == 0) {
                *piVar6 = iVar4;
              }
              if ((pointer)((long)local_2e8.points.
                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start - (long)pfVar2) !=
                  (pointer)local_358.distances.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_finish) goto LAB_00104346;
              uVar15 = (uint)uVar7;
              if (uVar15 < 2 || (uVar7 & 1) == 0) {
                bVar19 = uVar15 == 2;
              }
              else {
                bVar19 = uVar15 < 9;
                if ((!bVar19) && (uVar15 + (int)((uVar7 & 0xffffffff) / 3) * -3 != 0)) {
                  uVar16 = 5;
                  do {
                    bVar19 = uVar15 < uVar16 * uVar16;
                    if (uVar15 < uVar16 * uVar16) break;
                    uVar1 = (ulong)uVar16;
                    uVar16 = uVar16 + 2;
                  } while ((int)((uVar7 & 0xffffffff) % uVar1) != 0);
                }
              }
              argv = local_310;
              if (!bVar19) goto LAB_00104346;
              goto LAB_00103b88;
            }
            std::__throw_out_of_range("stol");
          }
          std::__throw_invalid_argument("stol");
          goto LAB_0010436f;
        }
        if (local_2d0 != (int *)0x0) {
          do {
            iVar14 = -1;
LAB_001042db:
            print_usage_and_exit(iVar14);
LAB_001042e0:
            print_usage_and_exit(-1);
LAB_001042ea:
            std::__throw_invalid_argument("stol");
LAB_001042f6:
            std::__throw_out_of_range("stol");
LAB_00104302:
            print_usage_and_exit(-1);
LAB_0010430c:
            std::__throw_out_of_range("stof");
LAB_00104318:
            std::__throw_invalid_argument("stof");
LAB_00104324:
            print_usage_and_exit(-1);
LAB_0010432e:
            std::__throw_out_of_range("stof");
LAB_0010433a:
            std::__throw_invalid_argument("stof");
LAB_00104346:
            print_usage_and_exit(-1);
          } while( true );
        }
        local_2d0 = (int *)argv[iVar14];
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < local_2f0._0_4_);
    uVar15 = (uint)(char)local_2f8;
    format = (file_format)local_318;
    piVar6 = local_2d0;
  }
  piVar13 = (istream *)local_238;
  std::ifstream::ifstream(piVar13,(char *)piVar6,_S_in);
  if ((piVar6 != (int *)0x0) && ((abStack_218[local_238[0][-3]] & 5) != 0)) {
LAB_0010436f:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"couldn\'t open file ",0x13);
    sVar10 = strlen((char *)piVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,(char *)piVar6,sVar10);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    exit(-1);
  }
  local_31c = local_304;
  if (format == POINT_CLOUD) {
    if (3.4028235e+38 <= local_35c) goto LAB_00103da6;
    if (piVar6 == (int *)0x0) {
      piVar13 = (istream *)&std::cin;
    }
    else {
      piVar13 = (istream *)local_238;
    }
    read_point_cloud(&local_2e8,piVar13);
    Gudhi::ripser::Sparse_distance_matrix<Params>::
    Sparse_distance_matrix<Gudhi::ripser::Euclidean_distance_matrix<Params>>
              ((Sparse_distance_matrix<Params> *)&local_358,&local_2e8,local_35c);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&local_2e8.points);
    local_278.
    super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_278.
    super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_278.
    super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    ppfStack_260 = local_358.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Gudhi::ripser::ripser<Gudhi::ripser::Sparse_distance_matrix<Params>,main::__0&,main::__1&>
              ((ripser *)&local_278,(Sparse_distance_matrix<Params> *)(ulong)uVar15,(int)local_300,
               local_35c,(uint)&local_31c,in_R8,in_R9);
    this = &local_278;
  }
  else {
    if (format != SPARSE) {
LAB_00103da6:
      if (piVar6 == (int *)0x0) {
        piVar13 = (istream *)&std::cin;
      }
      else {
        piVar13 = (istream *)local_238;
      }
      read_file(&local_358,piVar13,format);
      fVar21 = INFINITY;
      if ((3.4028235e+38 <= local_35c) &&
         (uVar16 = (uint)((ulong)((long)local_358.rows.
                                        super__Vector_base<float_*,_std::allocator<float_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_358.rows.
                                       super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl
                                       .super__Vector_impl_data._M_start) >> 3), 0 < (int)uVar16)) {
        paVar11 = (anon_class_1_0_00000001 *)(ulong)(uVar16 & 0x7fffffff);
        fVar21 = INFINITY;
        paVar12 = (anon_class_1_0_00000001 *)0x0;
        do {
          paVar17 = (anon_class_1_0_00000001 *)0x0;
          fVar20 = -INFINITY;
          do {
            fVar22 = 0.0;
            if (paVar12 != paVar17) {
              paVar18 = paVar17;
              if (paVar17 < paVar12) {
                paVar18 = paVar12;
              }
              in_R8 = paVar17;
              if (paVar12 < paVar17) {
                in_R8 = paVar12;
              }
              fVar22 = local_358.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)paVar18][(long)in_R8];
            }
            if (fVar22 <= fVar20) {
              fVar22 = fVar20;
            }
            fVar20 = fVar22;
            paVar17 = paVar17 + 1;
          } while (paVar11 != paVar17);
          if (fVar21 <= fVar20) {
            fVar20 = fVar21;
          }
          fVar21 = fVar20;
          paVar12 = paVar12 + 1;
        } while (paVar12 != paVar11);
      }
      local_2f8 = CONCAT44(local_2f8._4_4_,fVar21);
      if (local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_2f0 = INFINITY;
        local_310 = (char **)0xfff0000000000000;
      }
      else {
        fVar20 = -INFINITY;
        fVar21 = INFINITY;
        pvVar9 = (pointer)local_358.distances.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start;
        do {
          fVar22 = *(float *)&(pvVar9->
                              super__Vector_base<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>
                              )._M_impl.super__Vector_impl_data._M_start;
          fVar3 = fVar22;
          if (fVar22 == INFINITY || fVar22 <= fVar20) {
            fVar3 = fVar20;
          }
          fVar20 = fVar3;
          if (fVar21 <= fVar22) {
            fVar22 = fVar21;
          }
          fVar21 = fVar22;
          pvVar9 = (pointer)((long)&(pvVar9->
                                    super__Vector_base<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 4);
        } while (pvVar9 != (pointer)local_358.distances.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_finish);
        local_2f0 = (double)fVar21;
        local_310 = (char **)(double)fVar20;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value range: [",0xe)
      ;
      poVar8 = std::ostream::_M_insert<double>(local_2f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
      poVar8 = std::ostream::_M_insert<double>((double)local_310);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if (3.4028235e+38 <= local_35c) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"distance matrix with ",0x15);
        poVar8 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            (int)((ulong)((long)local_358.rows.
                                                super__Vector_base<float_*,_std::allocator<float_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_358.rows.
                                               super__Vector_base<float_*,_std::allocator<float_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," points, using threshold at enclosing radius ",0x2d);
        poVar8 = std::ostream::_M_insert<double>((double)(float)local_2f8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        local_2c8.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_2c8.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_2c8.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_2c8.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_358.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2c8.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_358.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_2c8.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_358.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_358.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_358.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_358.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if ((uint)local_300 == 2) {
          Gudhi::ripser::
          help1<false,Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,main::__0&,main::__1&>
                    (&local_2c8,uVar15,(float)local_2f8,(uint)&local_31c,
                     (anon_class_1_0_00000001 *)0x0,(anon_class_4_1_a88e3f2b *)in_R8);
        }
        else {
          Gudhi::ripser::
          help1<true,Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,main::__0&,main::__1&>
                    (&local_2c8,uVar15,(float)local_2f8,(uint)local_300,
                     (anon_class_1_0_00000001 *)&local_31c,(anon_class_4_1_a88e3f2b *)in_R8);
        }
        if (local_2c8.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2c8.rows.super__Vector_base<float_*,_std::allocator<float_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_2c8.rows.super__Vector_base<float_*,_std::allocator<float_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2c8.rows.super__Vector_base<float_*,_std::allocator<float_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((pointer)local_2c8.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2c8.distances.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_2c8.distances.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_2c8.distances.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"sparse distance matrix with ",0x1c);
        poVar8 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            (int)((ulong)((long)local_358.rows.
                                                super__Vector_base<float_*,_std::allocator<float_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_358.rows.
                                               super__Vector_base<float_*,_std::allocator<float_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," points and ",0xc);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
        iVar14 = (int)((ulong)((long)local_358.rows.
                                     super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)local_358.rows.
                                    super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,((iVar14 + -1) * iVar14) / 2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," entries",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        Gudhi::ripser::Sparse_distance_matrix<Params>::
        Sparse_distance_matrix<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>>
                  (&local_298,&local_358,local_35c);
        Gudhi::ripser::ripser<Gudhi::ripser::Sparse_distance_matrix<Params>,main::__0&,main::__1&>
                  ((ripser *)&local_298,(Sparse_distance_matrix<Params> *)(ulong)uVar15,
                   (int)local_300,local_35c,(uint)&local_31c,in_R8,in_R9);
        std::
        vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
        ::~vector(&local_298.neighbors);
      }
      if (local_358.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_358.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_358.rows.super__Vector_base<float_*,_std::allocator<float_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_358.rows.super__Vector_base<float_*,_std::allocator<float_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_358.distances.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_358.distances.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_358.distances.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_001042b8;
    }
    if (piVar6 == (int *)0x0) {
      piVar13 = (istream *)&std::cin;
    }
    read_sparse_distance_matrix((Sparse_distance_matrix *)&local_358,piVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"sparse distance matrix with ",0x1c);
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        (int)((ulong)((long)local_358.distances.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_358.distances.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start) >> 3) * -0x55555555);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," points and ",0xc);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
    iVar14 = (int)((ulong)((long)local_358.distances.
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_358.distances.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,((iVar14 + -1) * iVar14) / 2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," entries",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    local_258.
    super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_258.
    super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_258.
    super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    ppfStack_240 = local_358.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_358.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Gudhi::ripser::ripser<Gudhi::ripser::Sparse_distance_matrix<Params>,main::__0&,main::__1&>
              ((ripser *)&local_258,(Sparse_distance_matrix<Params> *)(ulong)uVar15,(int)local_300,
               local_35c,(uint)&local_31c,in_R8,in_R9);
    this = &local_258;
  }
  std::
  vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  ::~vector(this);
  std::
  vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  ::~vector((vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
             *)&local_358);
LAB_001042b8:
  std::ifstream::~ifstream(local_238);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  const char* filename = nullptr;

  file_format format = DISTANCE_MATRIX;

  dimension_t dim_max = 1;
  value_t threshold = std::numeric_limits<value_t>::max();
  float ratio = 1;
  coefficient_t modulus = 2;

  for (int i = 1; i < argc; ++i) {
    const std::string arg(argv[i]);
    if (arg == "--help") {
      print_usage_and_exit(0);
    } else if (arg == "--dim") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      dim_max = std::stol(parameter, &next_pos);
      if (next_pos != parameter.size()) print_usage_and_exit(-1);
    } else if (arg == "--threshold") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      threshold = std::stof(parameter, &next_pos);
      if (next_pos != parameter.size()) print_usage_and_exit(-1);
    } else if (arg == "--ratio") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      ratio = std::stof(parameter, &next_pos);
      if (next_pos != parameter.size()) print_usage_and_exit(-1);
    } else if (arg == "--format") {
      std::string parameter = std::string(argv[++i]);
      if (parameter.rfind("lower", 0) == 0)
        format = LOWER_DISTANCE_MATRIX;
      else if (parameter.rfind("upper", 0) == 0)
        format = UPPER_DISTANCE_MATRIX;
      else if (parameter.rfind("dist", 0) == 0)
        format = DISTANCE_MATRIX;
      else if (parameter.rfind("point", 0) == 0)
        format = POINT_CLOUD;
      else if (parameter == "dipha")
        format = DIPHA;
      else if (parameter == "sparse")
        format = SPARSE;
      else if (parameter == "binary")
        format = BINARY;
      else
        print_usage_and_exit(-1);
    } else if (arg == "--modulus") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      modulus = std::stol(parameter, &next_pos);
      if (next_pos != parameter.size() || !Gudhi::ripser::is_prime(modulus)) print_usage_and_exit(-1);
    } else {
      if (filename) { print_usage_and_exit(-1); }
      filename = argv[i];
    }
  }

  std::ifstream file_stream(filename);
  if (filename && file_stream.fail()) {
    std::cerr << "couldn't open file " << filename << std::endl;
    exit(-1);
  }

  auto output_dim = [](dimension_t dim) {
    std::cout << "persistence intervals in dim " << (int)dim << ":" << std::endl;
  };
  auto output_pair = [ratio](value_t birth, value_t death) {
#ifdef GUDHI_INDICATE_PROGRESS
    // Not necessary if we redirect stdout
    std::cerr << Gudhi::ripser::clear_line << std::flush;
#endif
    if (death == std::numeric_limits<value_t>::infinity())
      std::cout << " [" << birth << ", )" << std::endl;
    else if (death > birth * ratio)
      std::cout << " [" << birth << "," << death << ")" << std::endl;
  };
  if (format == SPARSE) {
    Sparse_distance_matrix dist =
      read_sparse_distance_matrix(filename ? file_stream : std::cin);
    std::cout << "sparse distance matrix with " << dist.size() << " points and "
      << dist.num_edges << "/" << (dist.size() * (dist.size() - 1)) / 2 << " entries"
      << std::endl;

    ripser(std::move(dist), dim_max, threshold, modulus, output_dim, output_pair);
  } else if (format == POINT_CLOUD && threshold < std::numeric_limits<value_t>::max()) {
    Sparse_distance_matrix dist(read_point_cloud(filename ? file_stream : std::cin), threshold);
    ripser(std::move(dist), dim_max, threshold, modulus, output_dim, output_pair);
  } else {
    Compressed_lower_distance_matrix dist =
      read_file(filename ? file_stream : std::cin, format);

    value_t min = std::numeric_limits<value_t>::infinity(),
            max = -std::numeric_limits<value_t>::infinity(), max_finite = max;
    std::size_t num_edges = 0;

    value_t enclosing_radius = std::numeric_limits<value_t>::infinity();
    if (threshold >= std::numeric_limits<value_t>::max()) {
      for (vertex_t i = 0; i < dist.size(); ++i) {
        value_t r_i = -std::numeric_limits<value_t>::infinity();
        for (vertex_t j = 0; j < dist.size(); ++j) r_i = std::max(r_i, dist(i, j));
        enclosing_radius = std::min(enclosing_radius, r_i);
      }
    }

    for (auto d : dist.distances) {
      min = std::min(min, d);
      max = std::max(max, d);
      if (d != std::numeric_limits<value_t>::infinity()) max_finite = std::max(max_finite, d);
      if (d <= threshold) ++num_edges;
    }
    std::cout << "value range: [" << min << "," << max_finite << "]" << std::endl;

    if (threshold >= std::numeric_limits<value_t>::max()) {
      std::cout << "distance matrix with " << dist.size()
        << " points, using threshold at enclosing radius " << enclosing_radius
        << std::endl;
      ripser(std::move(dist), dim_max, enclosing_radius, modulus, output_dim, output_pair);
    } else {
      std::cout << "sparse distance matrix with " << dist.size() << " points and "
        << num_edges << "/" << (dist.size() * (dist.size() - 1)) / 2 << " entries"
        << std::endl;

      ripser(Sparse_distance_matrix(std::move(dist), threshold), dim_max, threshold, modulus, output_dim, output_pair);
    }
  }
  return 0;
}